

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_program
xmrig::OclLib::createProgramWithSource
          (cl_context context,cl_uint count,char **strings,size_t *lengths,cl_int *errcode_ret)

{
  char *fmt;
  char *pcVar1;
  size_t *in_RCX;
  char **in_RDX;
  cl_uint in_ESI;
  cl_context in_RDI;
  cl_int *in_R8;
  cl_program result;
  cl_program local_8;
  
  local_8 = (*pCreateProgramWithSource)(in_RDI,in_ESI,in_RDX,in_RCX,in_R8);
  fmt = kErrorTemplate;
  if (*in_R8 != 0) {
    pcVar1 = OclError::toString(*in_R8);
    Log::print(ERR,fmt,pcVar1,kCreateProgramWithSource);
    local_8 = (cl_program)0x0;
  }
  return local_8;
}

Assistant:

cl_program xmrig::OclLib::createProgramWithSource(cl_context context, cl_uint count, const char **strings, const size_t *lengths, cl_int *errcode_ret) noexcept
{
    assert(pCreateProgramWithSource != nullptr);

    auto result = pCreateProgramWithSource(context, count, strings, lengths, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(*errcode_ret), kCreateProgramWithSource);

        return nullptr;
    }

    return result;
}